

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

bool __thiscall Catch::Clara::Opt::isMatch(Opt *this,StringRef optToken)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong __n;
  ulong uVar5;
  char *__s2;
  char *__s1;
  StringRef *name;
  pointer pSVar6;
  
  uVar5 = optToken.m_size;
  __s2 = optToken.m_start;
  uVar4 = uVar5;
  if (*__s2 == '-') {
    __s2 = __s2 + 1;
    uVar4 = uVar5 - 1;
    if (uVar5 <= uVar5 - 1) {
      uVar4 = uVar5;
    }
    if (uVar5 < 2) {
      __s2 = "";
      uVar4 = 0;
    }
  }
  pSVar6 = (this->m_optNames).
           super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (this->m_optNames).
           super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    bVar2 = pSVar6 != pSVar1;
    if (!bVar2) {
      return bVar2;
    }
    __s1 = pSVar6->m_start;
    uVar5 = pSVar6->m_size;
    __n = uVar5;
    if (*__s1 == '-') {
      __s1 = __s1 + 1;
      __n = uVar5 - 1;
      if (uVar5 <= uVar5 - 1) {
        __n = uVar5;
      }
      if (uVar5 < 2) {
        __s1 = "";
        __n = 0;
      }
    }
    if ((__n == uVar4) && (iVar3 = bcmp(__s1,__s2,__n), iVar3 == 0)) break;
    pSVar6 = pSVar6 + 1;
  }
  return bVar2;
}

Assistant:

bool Opt::isMatch(StringRef optToken) const {
            auto normalisedToken = normaliseOpt(optToken);
            for (auto const& name : m_optNames) {
                if (normaliseOpt(name) == normalisedToken)
                    return true;
            }
            return false;
        }